

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::Grow(TemporaryBuffer *this)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  uint local_24;
  OLECHAR *pOStack_20;
  ULONG cbNew;
  byte *prgbOld;
  byte *prgbNew;
  TemporaryBuffer *this_local;
  
  prgbNew = (byte *)this;
  if (this->m_pscanner == (Scanner<UTF8EncodingPolicyBase<false>_> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                       ,0x2ab,"(m_pscanner != nullptr)","m_pscanner != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOStack_20 = this->m_prgch;
  HVar3 = ULongMult(this->m_cchMax,4,&local_24);
  if (-1 < HVar3) {
    if (pOStack_20 == (OLECHAR *)this->m_rgbInit) {
      prgbOld = (byte *)malloc((ulong)local_24);
      if (prgbOld == (byte *)0x0) {
        Error(this->m_pscanner,-0x7ff5fc17);
      }
      js_memcpy_s(prgbOld,(ulong)local_24,pOStack_20,(ulong)this->m_ichCur << 1);
    }
    else {
      prgbOld = (byte *)realloc(pOStack_20,(ulong)local_24);
      if (prgbOld == (byte *)0x0) {
        Error(this->m_pscanner,-0x7ff5fc17);
      }
    }
    this->m_prgch = (OLECHAR *)prgbOld;
    this->m_cchMax = local_24 >> 1;
    return;
  }
  Error(this->m_pscanner,-0x7ff5fc17);
}

Assistant:

void Grow()
        {
            Assert(m_pscanner != nullptr);
            byte *prgbNew;
            byte *prgbOld = (byte *)m_prgch;

            ULONG cbNew;
            if (FAILED(ULongMult(m_cchMax, sizeof(OLECHAR) * 2, &cbNew)))
            {
                m_pscanner->Error(ERRnoMemory);
            }

            if (prgbOld == m_rgbInit)
            {
                if (nullptr == (prgbNew = static_cast<byte*>(malloc(cbNew))))
                    m_pscanner->Error(ERRnoMemory);
                js_memcpy_s(prgbNew, cbNew, prgbOld, m_ichCur * sizeof(OLECHAR));
            }
            else if (nullptr == (prgbNew = static_cast<byte*>(realloc(prgbOld, cbNew))))
            {
                m_pscanner->Error(ERRnoMemory);
            }

            m_prgch = (OLECHAR*)prgbNew;
            m_cchMax = cbNew / sizeof(OLECHAR);
        }